

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O1

bool __thiscall
cmCTestVC::RunChild(cmCTestVC *this,char **cmd,OutputParser *out,OutputParser *err,char *workDir,
                   Encoding encoding)

{
  int iVar1;
  ostream *poVar2;
  cmsysProcess *cp;
  string local_50;
  
  poVar2 = this->Log;
  ComputeCommandLine_abi_cxx11_(&local_50,(cmCTestVC *)cmd,(char **)out);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp,cmd);
  if (workDir == (char *)0x0) {
    workDir = (this->SourceDirectory)._M_dataplus._M_p;
  }
  cmsysProcess_SetWorkingDirectory(cp,workDir);
  cmProcessTools::RunProcess(cp,out,err,encoding);
  iVar1 = cmsysProcess_GetExitValue(cp);
  cmsysProcess_Delete(cp);
  return iVar1 == 0;
}

Assistant:

bool cmCTestVC::RunChild(char const* const* cmd, OutputParser* out,
                         OutputParser* err, const char* workDir,
                         Encoding encoding)
{
  this->Log << this->ComputeCommandLine(cmd) << "\n";

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, cmd);
  workDir = workDir ? workDir : this->SourceDirectory.c_str();
  cmsysProcess_SetWorkingDirectory(cp, workDir);
  this->RunProcess(cp, out, err, encoding);
  int result = cmsysProcess_GetExitValue(cp);
  cmsysProcess_Delete(cp);
  return result == 0;
}